

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xc_kernel.cxx
# Opt level: O0

XCKernel * __thiscall ExchCXX::XCKernel::operator=(XCKernel *this,XCKernel *other)

{
  XCKernel *pXVar1;
  XCKernel *in_RDI;
  XCKernel *in_stack_ffffffffffffffe0;
  
  XCKernel(in_stack_ffffffffffffffe0,in_RDI);
  pXVar1 = operator=(in_stack_ffffffffffffffe0,in_RDI);
  ~XCKernel((XCKernel *)0x189d03);
  return pXVar1;
}

Assistant:

XCKernel& XCKernel::operator=( const XCKernel& other ) {
  return *this = XCKernel(other);
}